

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O1

void __thiscall leveldb::anon_unknown_3::DBIter::SeekToLast(DBIter *this)

{
  pointer pcVar1;
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28 [16];
  
  this->direction_ = kReverse;
  pcVar1 = (this->saved_value_)._M_dataplus._M_p;
  if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)pcVar1 == &(this->saved_value_).field_2) ||
     ((this->saved_value_).field_2._M_allocated_capacity < 0x100001)) {
    (this->saved_value_)._M_string_length = 0;
    *pcVar1 = '\0';
  }
  else {
    local_30 = 0;
    local_28[0] = 0;
    local_38 = local_28;
    std::__cxx11::string::swap((string *)&local_38);
    if (local_38 != local_28) {
      operator_delete(local_38);
    }
  }
  (*this->iter_->_vptr_Iterator[4])();
  FindPrevUserEntry(this);
  return;
}

Assistant:

void DBIter::SeekToLast() {
            direction_ = kReverse;
            ClearSavedValue();
            iter_->SeekToLast();
            FindPrevUserEntry();
        }